

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O3

sexp_conflict
utf32_2_str(sexp_conflict ctx,char *bv,int len,sexp_conflict endianness,int endianness_mandatory)

{
  uint uVar1;
  sexp_conflict psVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uchar *p;
  bool bVar9;
  
  bVar9 = (((ctx->value).type.setters)->value).type.slots != endianness;
  if (3 < len && endianness_mandatory == 0) {
    uVar7 = 4;
    if (*(int *)bv == -0x20000) {
      bVar9 = true;
      goto LAB_00102778;
    }
    if (*(int *)bv == 0xfeff) goto LAB_00102778;
  }
  uVar7 = 0;
LAB_00102778:
  lVar8 = (long)len;
  uVar7 = uVar7 | 3;
  lVar3 = 1;
  if ((long)uVar7 < lVar8) {
    lVar3 = 0;
    uVar4 = uVar7;
    do {
      uVar5 = *(uint *)(bv + (uVar4 - 3));
      uVar1 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      if (!bVar9) {
        uVar1 = uVar5;
      }
      lVar6 = 1;
      if ((0x7f < (int)uVar1) && (lVar6 = 2, 0x7ff < uVar1)) {
        lVar6 = 4 - (ulong)(uVar1 < 0x10000);
      }
      lVar3 = lVar3 + lVar6;
      uVar4 = uVar4 + 4;
    } while ((long)uVar4 < lVar8);
    lVar3 = lVar3 * 2 + 1;
  }
  psVar2 = (sexp_conflict)sexp_make_string_op(ctx,0,2,lVar3,0x43e);
  if ((((ulong)psVar2 & 3) == 0 && psVar2 != (sexp_conflict)0x0) &&
     (psVar2->tag == 9 && (long)uVar7 < lVar8)) {
    p = (uchar *)((((psVar2->value).type.cpl)->value).flonum_bits +
                 (long)(((psVar2->value).type.name)->value).flonum_bits);
    do {
      uVar5 = *(uint *)(bv + (uVar7 - 3));
      uVar1 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      if (!bVar9) {
        uVar1 = uVar5;
      }
      uVar5 = 1;
      if ((0x7f < (int)uVar1) && (uVar5 = 2, 0x7ff < uVar1)) {
        uVar5 = 4 - (uVar1 < 0x10000);
      }
      utf8_encode_char(p,uVar5,uVar1);
      p = p + uVar5;
      uVar7 = uVar7 + 4;
    } while ((long)uVar7 < lVar8);
  }
  return psVar2;
}

Assistant:

sexp utf32_2_str(sexp ctx, char* bv, int len, sexp endianness, int endianness_mandatory) {
  int swap = endianness != sexp_global(ctx, SEXP_G_ENDIANNESS);
  uint32_t ch;
  sexp_sint_t i, ch_len, utf8_len=0, start=0;
  sexp res;
  unsigned char* dst;
  if (!endianness_mandatory && len>3) {
    ch = *(uint32_t*)(bv);
    if (ch == 0xFFFE0000) {
      swap = 1;
      start = 4;
    } else if (ch == 0xFEFF) {
      start = 4;
    }
  }
  for (i=start; i+3<len; i+=4) {
    ch = swap ? sexp_swap_u32(*((uint32_t*)(bv+i))) : *((uint32_t*)(bv+i));
    utf8_len += utf8_char_byte_count(ch);
  }
  res = sexp_make_string(ctx, sexp_make_fixnum(utf8_len), SEXP_VOID);
  if (!(res && sexp_stringp(res))) return res;
  dst = (unsigned char*) sexp_string_data(res);
  for (i=start; i+3<len; i+=4) {
    ch = swap ? sexp_swap_u32(*((uint32_t*)(bv+i))) : *((uint32_t*)(bv+i));
    ch_len = utf8_char_byte_count(ch);
    utf8_encode_char(dst, ch_len, ch);
    dst += ch_len;
  }
  return res;
}